

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleRateConverter.cpp
# Opt level: O2

void __thiscall
MT32Emu::SampleRateConverter::getOutputSamples(SampleRateConverter *this,float *buffer,uint length)

{
  if (this->useSynthDelegate == true) {
    Synth::render((Synth *)this->srcDelegate,buffer,length);
    return;
  }
  (*(code *)((((Synth *)this->srcDelegate)->rhythmTempMemoryRegion->super_MemoryRegion).synth)->
            timbreTempMemoryRegion)();
  return;
}

Assistant:

void SampleRateConverter::getOutputSamples(float *buffer, unsigned int length) {
	if (useSynthDelegate) {
		static_cast<Synth *>(srcDelegate)->render(buffer, length);
		return;
	}

#if MT32EMU_WITH_LIBSOXR_RESAMPLER
	static_cast<SoxrAdapter *>(srcDelegate)->getOutputSamples(buffer, length);
#elif MT32EMU_WITH_LIBSAMPLERATE_RESAMPLER
	static_cast<SamplerateAdapter *>(srcDelegate)->getOutputSamples(buffer, length);
#elif MT32EMU_WITH_INTERNAL_RESAMPLER
	static_cast<InternalResampler *>(srcDelegate)->getOutputSamples(buffer, length);
#else
	Synth::muteSampleBuffer(buffer, length);
#endif
}